

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBytecodeGenerator::GenerateFunction::AutoCleanupGeneratorState::~AutoCleanupGeneratorState
          (AutoCleanupGeneratorState *this)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  FunctionBody *pFVar2;
  WasmReaderBase *pWVar3;
  AutoCleanupGeneratorState *this_local;
  
  if (this->gen != (WasmBytecodeGenerator *)0x0) {
    pFVar2 = WasmBytecodeGenerator::GetFunctionBody(this->gen);
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar2);
    pFVar2 = WasmBytecodeGenerator::GetFunctionBody(this->gen);
    functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar2);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01ec1678,WasmBytecodePhase,sourceContextId,functionId);
    if (bVar1) {
      Output::Print(L"\nHad Compilation error!");
      Output::Print(L"\n");
      Output::Flush();
    }
    pWVar3 = GetReader(this->gen);
    (*pWVar3->_vptr_WasmReaderBase[3])();
    (*this->gen->m_originalWriter->_vptr_IWasmByteCodeWriter[3])();
  }
  return;
}

Assistant:

~AutoCleanupGeneratorState()
        {
            if (gen)
            {
                TRACE_WASM(PHASE_TRACE(Js::WasmBytecodePhase, gen->GetFunctionBody()), _u("\nHad Compilation error!"));
                gen->GetReader()->FunctionEnd();
                gen->m_originalWriter->Reset();
            }
        }